

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O1

void gauden_compute_norm(gauden_t *g)

{
  float32 ***pppfVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  float32 fVar5;
  
  if (g->norm != (float32 ***)0x0) {
    ckd_free_3d(g->norm);
  }
  pppfVar1 = (float32 ***)
             __ckd_calloc_3d__((ulong)g->n_mgau,(ulong)g->n_feat,(ulong)g->n_density,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                               ,0x179);
  g->norm = pppfVar1;
  if (g->n_mgau != 0) {
    uVar3 = 0;
    do {
      if (g->n_feat != 0) {
        uVar4 = 0;
        do {
          if (g->n_density != 0) {
            uVar2 = 0;
            do {
              if (g->fullvar == (vector_t ****)0x0) {
                fVar5 = diag_norm(g->var[uVar3][uVar4][uVar2],g->veclen[uVar4]);
              }
              else {
                fVar5 = full_norm(g->fullvar[uVar3][uVar4][uVar2],g->veclen[uVar4]);
              }
              g->norm[uVar3][uVar4][uVar2] = fVar5;
              uVar2 = uVar2 + 1;
            } while (uVar2 < g->n_density);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < g->n_feat);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < g->n_mgau);
  }
  return;
}

Assistant:

void
gauden_compute_norm(gauden_t *g)
{
    uint32 i, j, k;

    if (g->norm) {
	ckd_free_3d((void ***)g->norm);
    }

    g->norm  = (float32 ***) ckd_calloc_3d(g->n_mgau, g->n_feat, g->n_density,
					  sizeof(float32));

    for (i = 0; i < g->n_mgau; i++) {
	for (j = 0; j < g->n_feat; j++) {
	    for (k = 0; k < g->n_density; k++) {
		if (g->fullvar)
		    g->norm[i][j][k] = full_norm(g->fullvar[i][j][k], g->veclen[j]);
		else
		    g->norm[i][j][k] = diag_norm(g->var[i][j][k], g->veclen[j]);
	    }
	}
    }
}